

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O2

void __thiscall
TPZTransfer<std::complex<double>_>::SetBlockMatrix
          (TPZTransfer<std::complex<double>_> *this,int row,int col,
          TPZFMatrix<std::complex<double>_> *mat)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int num;
  int iVar4;
  long lVar5;
  TPZFMatrix<std::complex<double>_> bl;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  iVar1 = (this->fColPosition).fStore[row];
  lVar5 = (long)iVar1;
  iVar4 = (this->fNumberofColumnBlocks).fStore[row];
  if (iVar4 == -1 || lVar5 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : ");
    poVar2 = std::operator<<(poVar2," row = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,row);
    poVar2 = std::operator<<(poVar2," col = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,col);
    poVar2 = std::operator<<(poVar2," colpos = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," numcolblocks = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0xa4);
  }
  iVar4 = iVar4 + iVar1;
  iVar3 = iVar4;
  if (iVar4 < iVar1) {
    iVar3 = iVar1;
  }
  do {
    if (iVar4 <= lVar5) {
LAB_00c85ddc:
      if (iVar3 == iVar4) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "TPZTransfer<TVar>::SetBlockMatrix column not found for row = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,row);
        poVar2 = std::operator<<(poVar2," col = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,col);
        std::endl<char,std::char_traits<char>>(poVar2);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
                   ,0xad);
      }
      iVar1 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[row].dim;
      iVar4 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[col].dim;
      if (((mat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == (long)iVar1) &&
         ((mat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol == (long)iVar4)) {
        num = iVar1 * iVar4;
        ExpandDoubleValueEntries(this,num);
        TPZFMatrix<std::complex<double>_>::TPZFMatrix
                  (&local_c0,(long)iVar1,(long)iVar4,
                   (this->fDoubleValues).super_TPZVec<std::complex<double>_>.fStore +
                   this->fDoubleValLastUsed,(long)num);
        TPZFMatrix<std::complex<double>_>::operator=(&local_c0,mat);
        iVar1 = this->fDoubleValLastUsed;
        (this->fColumnBlockPosition).super_TPZVec<int>.fStore[iVar3] = iVar1;
        this->fDoubleValLastUsed = num + iVar1;
        TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
        return;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions :  nblrows = "
                              );
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2," nblcols = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
      poVar2 = std::operator<<(poVar2," mat.rows = ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2," mat.cols ");
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
                 ,0xb5);
    }
    if ((this->fColumnBlockNumber).super_TPZVec<int>.fStore[lVar5] == col) {
      iVar3 = (int)lVar5;
      goto LAB_00c85ddc;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void TPZTransfer<TVar>::SetBlockMatrix(int row, int col, TPZFMatrix<TVar> &mat){
	// sets the row,col block equal to matrix mat
	// if row col was not specified by AddBlockNumbers, an error
	//		will be issued and exit
	// find row,col
	int colpos = fColPosition[row];
	int numcolblocks = fNumberofColumnBlocks[row];
	if(colpos == -1 || numcolblocks == -1) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : "
		<< " row = " << row << " col = " << col << " colpos = " << colpos <<
		" numcolblocks = " << numcolblocks << endl;
		DebugStop();
	}
	int ic = colpos, lastic = colpos+numcolblocks;
	for(;ic<lastic;ic++) {
		if(fColumnBlockNumber[ic] == col) break;
	}
	if(ic == lastic) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix column not found for row = " << row <<
		" col = " << col << endl;
		DebugStop();
	}
	int nblrows = fRowBlock.Size(row);
	int nblcols = fColBlock.Size(col);
	if(nblrows != mat.Rows() || nblcols != mat.Cols()) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions : "
		" nblrows = " << nblrows << " nblcols = " << nblcols << " mat.rows = " <<
		mat.Rows() << " mat.cols " << mat.Cols() << endl;
		DebugStop();
	}
	ExpandDoubleValueEntries(nblrows*nblcols);
	TPZFMatrix<TVar> bl(nblrows,nblcols,&fDoubleValues[fDoubleValLastUsed],nblrows*nblcols);
	bl = mat;
	fColumnBlockPosition[ic] = fDoubleValLastUsed;
	fDoubleValLastUsed += nblrows*nblcols;
}